

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

SmallVectorImpl<int> * __thiscall
tf::SmallVectorImpl<int>::operator=(SmallVectorImpl<int> *this,SmallVectorImpl<int> *RHS)

{
  bool bVar1;
  iterator piVar2;
  iterator piVar3;
  size_type sVar4;
  size_t sVar5;
  SmallVectorImpl<int> *this_00;
  SmallVectorTemplateCommon<int,_void> *in_RSI;
  SmallVectorTemplateCommon<int,_void> *in_RDI;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  size_t in_stack_ffffffffffffff88;
  SmallVectorTemplateCommon<int,_void> *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  int *local_30;
  size_type local_28;
  
  if (in_RDI != in_RSI) {
    bVar1 = SmallVectorTemplateCommon<int,_void>::isSmall(in_RSI);
    if (bVar1) {
      sVar4 = SmallVectorTemplateCommon<int,_void>::size(in_stack_ffffffffffffff90);
      local_28 = SmallVectorTemplateCommon<int,_void>::size(in_stack_ffffffffffffff90);
      if (local_28 < sVar4) {
        sVar5 = SmallVectorTemplateCommon<int,_void>::capacity(in_stack_ffffffffffffff90);
        if (sVar5 < sVar4) {
          piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
          piVar3 = SmallVectorTemplateCommon<int,_void>::end(in_RDI);
          SmallVectorTemplateBase<int,_true>::destroy_range(piVar2,piVar3);
          piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
          SmallVectorTemplateCommon<int,_void>::setEnd(in_RDI,piVar2);
          local_28 = 0;
          SmallVectorTemplateBase<int,_true>::grow
                    ((SmallVectorTemplateBase<int,_true> *)in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88);
        }
        else if (local_28 != 0) {
          piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RSI);
          piVar3 = SmallVectorTemplateCommon<int,_void>::begin(in_RSI);
          piVar3 = piVar3 + local_28;
          SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
          std::move<int*,int*>(piVar3,piVar2,(int *)in_stack_ffffffffffffff90);
        }
        piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RSI);
        piVar2 = piVar2 + local_28;
        this_00 = (SmallVectorImpl<int> *)SmallVectorTemplateCommon<int,_void>::end(in_RSI);
        SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
        SmallVectorTemplateBase<int,true>::uninitialized_move<int*,int*>
                  ((int *)this_00,piVar2,(int *)0x12011f);
        piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
        SmallVectorTemplateCommon<int,_void>::setEnd(in_RDI,piVar2 + sVar4);
        clear(this_00);
      }
      else {
        local_30 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
        if (sVar4 != 0) {
          SmallVectorTemplateCommon<int,_void>::begin(in_RSI);
          SmallVectorTemplateCommon<int,_void>::end(in_RSI);
          local_30 = std::move<int*,int*>
                               (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                (int *)in_stack_ffffffffffffff90);
        }
        piVar2 = SmallVectorTemplateCommon<int,_void>::end(in_RDI);
        SmallVectorTemplateBase<int,_true>::destroy_range(local_30,piVar2);
        SmallVectorTemplateCommon<int,_void>::setEnd(in_RDI,local_30);
        clear((SmallVectorImpl<int> *)in_stack_ffffffffffffff90);
      }
    }
    else {
      piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
      piVar3 = SmallVectorTemplateCommon<int,_void>::end(in_RDI);
      SmallVectorTemplateBase<int,_true>::destroy_range(piVar2,piVar3);
      bVar1 = SmallVectorTemplateCommon<int,_void>::isSmall(in_RDI);
      if (!bVar1) {
        piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
        free(piVar2);
      }
      (in_RDI->super_SmallVectorBase).BeginX = (in_RSI->super_SmallVectorBase).BeginX;
      (in_RDI->super_SmallVectorBase).EndX = (in_RSI->super_SmallVectorBase).EndX;
      (in_RDI->super_SmallVectorBase).CapacityX = (in_RSI->super_SmallVectorBase).CapacityX;
      SmallVectorTemplateCommon<int,_void>::resetToSmall(in_RSI);
    }
  }
  return (SmallVectorImpl<int> *)in_RDI;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) std::free(this->begin());
    this->BeginX = RHS.BeginX;
    this->EndX = RHS.EndX;
    this->CapacityX = RHS.CapacityX;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->setEnd(NewEnd);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);

  RHS.clear();
  return *this;
}